

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_disabled.cpp
# Opt level: O2

void test_break(void)

{
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  SpyingSerial::clear(&Serial);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
  ASSERT_RE(&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void test_break() {
  Serial.clear();
  BREAK();
  ASSERT_RE(Serial.log(), "");
}